

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O2

bool __thiscall tf::Semaphore::_try_acquire_or_wait(Semaphore *this,Node *me)

{
  long lVar1;
  Node *local_20;
  
  local_20 = me;
  std::mutex::lock((mutex *)this);
  lVar1 = *(long *)(this + 0x30);
  if (lVar1 == 0) {
    SmallVectorTemplateBase<tf::Node_*,_true>::push_back
              ((SmallVectorTemplateBase<tf::Node_*,_true> *)(this + 0x38),&local_20);
  }
  else {
    *(long *)(this + 0x30) = lVar1 + -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return lVar1 != 0;
}

Assistant:

inline bool Semaphore::_try_acquire_or_wait(Node* me) {
  std::lock_guard<std::mutex> lock(_mtx);
  if(_cur_value > 0) {
    --_cur_value;
    return true;
  }
  else {
    _waiters.push_back(me);
    return false;
  }
}